

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  ostringstream os;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar3 = true;
  lVar4 = 0;
  do {
    if (bVar3) {
      bVar3 = false;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
    }
    iVar1 = *(int *)((long)this->numSamples + lVar4);
    if (iVar1 == -2) {
      lVar2 = 4;
      pcVar5 = "none";
LAB_012c341f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar2);
    }
    else {
      if (iVar1 == -1) {
        lVar2 = 3;
        pcVar5 = "tex";
        goto LAB_012c341f;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"rbo",3);
      std::ostream::operator<<(local_1a8,*(int *)((long)this->numSamples + lVar4));
    }
    lVar4 = lVar4 + 4;
    if (lVar4 == 0xc) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string NumSamplesParams::getName (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	for (const GLsizei* ns	=	DE_ARRAY_BEGIN(params.numSamples);
		 ns					!=	DE_ARRAY_END(params.numSamples);
		 ns++)
	{
		if (first)
			first = false;
		else
			os << "_";

		if (*ns == SAMPLES_NONE)
			os << "none";
		else if (*ns == SAMPLES_TEXTURE)
			os << "tex";
		else
			os << "rbo" << *ns;
	}
	return os.str();
}